

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cell.c
# Opt level: O3

REF_STATUS ref_cell_meshb_keyword(REF_CELL ref_cell,REF_INT *keyword)

{
  REF_STATUS RVar1;
  
  RVar1 = 6;
  if ((ulong)ref_cell->type < 0x10) {
    *keyword = *(REF_INT *)(&DAT_0021fe80 + (ulong)ref_cell->type * 4);
    RVar1 = 0;
  }
  return RVar1;
}

Assistant:

REF_FCN REF_STATUS ref_cell_meshb_keyword(REF_CELL ref_cell, REF_INT *keyword) {
  switch (ref_cell_type(ref_cell)) {
    case REF_CELL_EDG:
      *keyword = 5;
      break;
    case REF_CELL_ED2:
      *keyword = 25;
      break;
    case REF_CELL_ED3:
      *keyword = 92;
      break;
    case REF_CELL_TRI:
      *keyword = 6;
      break;
    case REF_CELL_TR2:
      *keyword = 24;
      break;
    case REF_CELL_TR3:
      *keyword = 90;
      break;
    case REF_CELL_QUA:
      *keyword = 7;
      break;
    case REF_CELL_QU2:
      *keyword = 27;
      break;
    case REF_CELL_TET:
      *keyword = 8;
      break;
    case REF_CELL_PYR:
      *keyword = 49;
      break;
    case REF_CELL_PRI:
      *keyword = 9;
      break;
    case REF_CELL_HEX:
      *keyword = 10;
      break;
    case REF_CELL_TE2:
      *keyword = 30;
      break;
    case REF_CELL_PY2:
      *keyword = 87;
      break;
    case REF_CELL_PR2:
      *keyword = 86;
      break;
    case REF_CELL_HE2:
      *keyword = 33;
      break;
    default:
      return REF_IMPLEMENT;
  }
  return REF_SUCCESS;
}